

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O3

bool_t NodeToString(tchar_t *Value,size_t ValueLen,node *Node)

{
  uint uVar1;
  long lVar2;
  
  *Value = '\0';
  if (Node != (node *)0x0) {
    uVar1 = NodeClassFlags(Node);
    if ((uVar1 & 1) == 0) {
      lVar2 = (**(code **)((long)Node->VMT + 0x18))(Node,5,Value,ValueLen);
      if (lVar2 != 0) {
        *Value = '\0';
      }
    }
    else {
      FourCCToString(Value,ValueLen,*(fourcc_t *)((long)Node->VMT + 8));
    }
  }
  return 1;
}

Assistant:

bool_t NodeToString(tchar_t* Value, size_t ValueLen, node* Node)
{
    Value[0]=0;

    if (Node)
    {
        if (NodeClassFlags(Node) & CFLAG_SINGLETON)
            FourCCToString(Value,ValueLen,Node_ClassId(Node));
        else
        {
            //TODO: use Base... (maybe NULL)
            if (Node_Get(Node,NODE_ID,Value,ValueLen*sizeof(tchar_t))!=ERR_NONE)
                Value[0] = 0;
        }
    }

    return 1;
}